

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O1

void nva_rsprint(nva_regspace *regspace,nva_err err,uint64_t val)

{
  uint uVar1;
  int iVar2;
  
  switch(err) {
  case NVA_ERR_SUCCESS:
    uVar1 = regspace->regsz - 1;
    if (7 < uVar1) {
      return;
    }
    if ((0x8bU >> (uVar1 & 0x1f) & 1) == 0) {
      return;
    }
    printf(&DAT_001052e0 + *(int *)(&DAT_001052e0 + (ulong)uVar1 * 4),val);
    return;
  case NVA_ERR_RANGE:
    uVar1 = 0x52;
    break;
  case NVA_ERR_REGSZ:
    uVar1 = 0x42;
    break;
  case NVA_ERR_NOSPC:
    uVar1 = 0x53;
    break;
  case NVA_ERR_MAP:
    uVar1 = 0x4d;
    break;
  default:
    abort();
  }
  putchar(0x20);
  if (0 < regspace->regsz) {
    iVar2 = 0;
    do {
      printf("%c%c",(ulong)uVar1,(ulong)uVar1);
      iVar2 = iVar2 + 1;
    } while (iVar2 < regspace->regsz);
  }
  return;
}

Assistant:

void nva_rsprint(struct nva_regspace *regspace, enum nva_err err, uint64_t val) {
	if (err) {
		int k;
		char ec = nva_rserrc(err);
		printf(" ");
		for (k = 0; k < regspace->regsz; k++)
			printf("%c%c", ec, ec);
	} else {
		switch (regspace->regsz) {
			case 1:
				printf (" %02"PRIx64, val);
				break;
			case 2:
				printf (" %04"PRIx64, val);
				break;
			case 4:
				printf (" %08"PRIx64, val);
				break;
			case 8:
				printf (" %016"PRIx64, val);
				break;
		}
	}
}